

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-linked_ptr.h
# Opt level: O2

void __thiscall
testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>::
depart(linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo> *this)

{
  TestInfo *this_00;
  bool bVar1;
  
  bVar1 = linked_ptr_internal::depart(&this->link_);
  if (bVar1) {
    this_00 = this->value_;
    if (this_00 != (TestInfo *)0x0) {
      ParameterizedTestCaseInfo<PushPopTest>::TestInfo::~TestInfo(this_00);
    }
    operator_delete(this_00);
    return;
  }
  return;
}

Assistant:

void depart() {
    if (link_.depart()) delete value_;
  }